

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

size_t fdb_estimate_space_used_from(fdb_file_handle *fhandle,fdb_snapshot_marker_t marker)

{
  fdb_kvs_handle *handle;
  fdb_status status;
  int64_t iVar1;
  uint64_t uVar2;
  size_t sVar3;
  uint64_t bid;
  err_log_callback *peVar4;
  size_t line_number;
  char *format;
  file_status_t fstatus;
  err_log_callback *local_1108;
  uint64_t version;
  size_t header_len;
  filemgr *local_10f0;
  uint64_t deltasize;
  fdb_snapshot_marker_t local_10e0;
  uint64_t kv_info_offset;
  uint64_t datasize;
  uint64_t nlivenodes;
  bid_t stale_root_bid;
  bid_t seq_root_bid;
  bid_t trie_root_bid;
  fdb_seqnum_t seqnum;
  char *compacted_filename;
  uint64_t header_flags;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t ndeletes;
  uint64_t ndocs;
  docio_object local_1078;
  uint8_t header_buf [4096];
  
  trie_root_bid = 0xffffffffffffffff;
  seq_root_bid = 0xffffffffffffffff;
  stale_root_bid = 0xffffffffffffffff;
  if (marker == 0 || fhandle == (fdb_file_handle *)0x0) {
LAB_001361f2:
    sVar3 = 0;
  }
  else {
    handle = fhandle->root;
    if (handle->file == (filemgr *)0x0) {
      peVar4 = &handle->log_callback;
      format = "File not open.";
      line_number = 0x2113;
      status = FDB_RESULT_FILE_NOT_OPEN;
LAB_00136290:
      sVar3 = 0;
      fdb_log_impl(peVar4,2,status,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                   ,"fdb_estimate_space_used_from",line_number,format);
    }
    else {
      fdb_check_file_reopen(handle,&fstatus);
      fdb_sync_db_header(handle);
      local_10f0 = handle->file;
      header_len = (size_t)(local_10f0->header).size;
      local_1108 = &handle->log_callback;
      bid = 0xffffffffffffffff;
      sVar3 = 0;
      local_10e0 = marker;
      do {
        if (bid == 0xffffffffffffffff) {
          bid = (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
          status = filemgr_fetch_header
                             (local_10f0,bid,header_buf,&header_len,(fdb_seqnum_t *)0x0,
                              (filemgr_header_revnum_t *)0x0,&deltasize,&version,(uint64_t *)0x0,
                              local_1108);
        }
        else {
          status = FDB_RESULT_SUCCESS;
          bid = filemgr_fetch_prev_header
                          (local_10f0,bid,header_buf,&header_len,&seqnum,
                           (filemgr_header_revnum_t *)0x0,&deltasize,&version,(uint64_t *)0x0,
                           local_1108);
        }
        peVar4 = local_1108;
        if (status != FDB_RESULT_SUCCESS) {
          format = "Failure to fetch DB header.";
          line_number = 0x212f;
          goto LAB_00136290;
        }
        if (header_len == 0) {
          format = "Failure to find DB header.";
          line_number = 0x2135;
          status = FDB_RESULT_KV_STORE_NOT_FOUND;
          goto LAB_00136290;
        }
        fdb_fetch_header(version,header_buf,&trie_root_bid,&seq_root_bid,&stale_root_bid,&ndocs,
                         &ndeletes,&nlivenodes,&datasize,&last_wal_flush_hdr_bid,&kv_info_offset,
                         &header_flags,&compacted_filename,(char **)0x0);
        if (bid == marker) {
          return sVar3 + datasize + (handle->config).blocksize * nlivenodes;
        }
        sVar3 = sVar3 + deltasize;
        if (kv_info_offset != 0xffffffffffffffff) {
          local_1078.field_3.seqnum = 0;
          local_1078.meta = (void *)0x0;
          local_1078.timestamp = 0;
          local_1078._20_4_ = 0;
          local_1078.key = (void *)0x0;
          local_1078.length.keylen = 0;
          local_1078.length.metalen = 0;
          local_1078.length.bodylen = 0;
          local_1078.length.bodylen_ondisk = 0;
          local_1078.length.flag = '\0';
          local_1078.length.checksum = '\0';
          local_1078.length.reserved = 0;
          local_1078.body = (void *)0x0;
          iVar1 = docio_read_doc(handle->dhandle,kv_info_offset,&local_1078,true);
          if (iVar1 < 1) {
            fdb_log_impl(local_1108,2,(fdb_status)iVar1,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                         ,"fdb_estimate_space_used_from",0x214c,"Read failure estimate_space_used.")
            ;
            goto LAB_001361f2;
          }
          uVar2 = _kvs_stat_get_sum_attr(local_1078.body,version,KVS_STAT_DELTASIZE);
          sVar3 = sVar3 + uVar2;
          free_docio_object(&local_1078,'\x01','\x01','\x01');
          marker = local_10e0;
        }
      } while (marker <= bid);
    }
  }
  return sVar3;
}

Assistant:

LIBFDB_API
size_t fdb_estimate_space_used_from(fdb_file_handle *fhandle,
                                    fdb_snapshot_marker_t marker)
{
    uint64_t deltasize;
    size_t ret = 0;
    fdb_kvs_handle *handle;
    struct filemgr *file;
    bid_t hdr_bid = BLK_NOT_FOUND, prev_bid;
    size_t header_len;
    uint8_t header_buf[FDB_BLOCKSIZE];
    bid_t trie_root_bid = BLK_NOT_FOUND;
    bid_t seq_root_bid = BLK_NOT_FOUND;
    bid_t stale_root_bid = BLK_NOT_FOUND;
    uint64_t ndocs;
    uint64_t ndeletes;
    uint64_t nlivenodes;
    uint64_t datasize;
    uint64_t last_wal_flush_hdr_bid;
    uint64_t kv_info_offset;
    uint64_t header_flags;
    uint64_t version;
    char *compacted_filename;
    fdb_seqnum_t seqnum;
    file_status_t fstatus;
    fdb_status status;

    if (!fhandle || !marker) {
        return 0;
    }
    handle = fhandle->root;
    if (!handle->file) {
        fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                FDB_RESULT_FILE_NOT_OPEN,
                "File not open.");
        return 0;
    }

    fdb_check_file_reopen(handle, &fstatus);
    fdb_sync_db_header(handle);

    // Start loading from current header
    file = handle->file;
    header_len = handle->file->header.size;

    // Reverse scan the file only summing up the delta.....
    while (marker <= hdr_bid) {
        if (hdr_bid == BLK_NOT_FOUND) {
            hdr_bid = handle->last_hdr_bid;
            status = filemgr_fetch_header(file, hdr_bid,
                                          header_buf, &header_len, NULL, NULL,
                                          &deltasize, &version, NULL,
                                          &handle->log_callback);
        } else {
            prev_bid = filemgr_fetch_prev_header(file, hdr_bid,
                                                 header_buf, &header_len,
                                                 &seqnum, NULL, &deltasize, &version,
                                                 NULL, &handle->log_callback);
            hdr_bid = prev_bid;
        }
        if (status != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, status,
                    "Failure to fetch DB header.");
            return 0;
        }
        if (header_len == 0) {
            status = FDB_RESULT_KV_STORE_NOT_FOUND; // can't work without header
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, status,
                    "Failure to find DB header.");
            return 0;
        }

        fdb_fetch_header(version, header_buf, &trie_root_bid, &seq_root_bid,
                         &stale_root_bid, &ndocs, &ndeletes, &nlivenodes, &datasize,
                         &last_wal_flush_hdr_bid, &kv_info_offset,
                         &header_flags, &compacted_filename, NULL);
        if (marker == hdr_bid) { // for the oldest header, sum up full values
            ret += datasize;
            ret += nlivenodes * handle->config.blocksize;
            break;
        } else { // for headers upto oldest header, sum up only deltas..
            ret += deltasize; // root kv store or single kv instance mode
            if (kv_info_offset != BLK_NOT_FOUND) { // Multi kv instance mode..
                int64_t doc_offset;
                struct docio_object doc;
                memset(&doc, 0, sizeof(struct docio_object));
                doc_offset = docio_read_doc(handle->dhandle, kv_info_offset,
                                            &doc, true);
                if (doc_offset <= 0) {
                    fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                            (fdb_status) doc_offset,
                            "Read failure estimate_space_used.");
                    return 0;
                }
                ret += _kvs_stat_get_sum_attr(doc.body, version,
                                              KVS_STAT_DELTASIZE);

                free_docio_object(&doc, 1, 1, 1);
            }
        }
    }

    return ret;
}